

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O0

void __thiscall leveldb::RecoveryTest::Open(RecoveryTest *this,Options *options)

{
  int local_378 [2];
  Tester local_370;
  undefined1 local_1c0 [424];
  Options *local_18;
  Options *options_local;
  RecoveryTest *this_local;
  
  local_18 = options;
  options_local = (Options *)this;
  test::Tester::Tester
            ((Tester *)(local_1c0 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0x42);
  OpenWithStatus((RecoveryTest *)local_1c0,(Options *)this);
  test::Tester::IsOk((Tester *)(local_1c0 + 8),(Status *)local_1c0);
  Status::~Status((Status *)local_1c0);
  test::Tester::~Tester((Tester *)(local_1c0 + 8));
  test::Tester::Tester
            (&local_370,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0x43);
  local_378[1] = 1;
  local_378[0] = NumLogs(this);
  test::Tester::IsEq<int,int>(&local_370,local_378 + 1,local_378);
  test::Tester::~Tester(&local_370);
  return;
}

Assistant:

void Open(Options* options = nullptr) {
    ASSERT_OK(OpenWithStatus(options));
    ASSERT_EQ(1, NumLogs());
  }